

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SequenceNode::do_render
          (SequenceNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  const_iterator __lhs;
  long in_RDI;
  shared_ptr<minja::TemplateNode> *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  *__range2;
  shared_ptr<minja::Context> *in_stack_00000380;
  ostringstream *in_stack_00000388;
  TemplateNode *in_stack_00000390;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::shared_ptr<minja::TemplateNode>_*,_std::vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RDI + 0x20;
  local_28._M_current =
       (shared_ptr<minja::TemplateNode> *)
       std::
       vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  __lhs = std::
          vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
          ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<minja::TemplateNode>_*,_std::vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_std::shared_ptr<minja::TemplateNode>_*,_std::vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         (vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_std::shared_ptr<minja::TemplateNode>_*,_std::vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>_>
            ::operator*(&local_28);
    std::__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x324f5b);
    TemplateNode::render(in_stack_00000390,in_stack_00000388,in_stack_00000380);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<minja::TemplateNode>_*,_std::vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
        for (const auto& child : children) child->render(out, context);
    }